

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O1

void __thiscall leveldb::Table::ReadFilter(Table *this,Slice *filter_handle_value)

{
  Rep *dbOptions;
  FilterBlockReader *this_00;
  void *pvVar1;
  ReadOptions opt;
  BlockContents block;
  BlockHandle filter_handle;
  Slice v;
  undefined1 local_78 [24];
  BlockContents local_60;
  Slice local_48;
  void *local_30;
  char *local_28;
  size_t sStack_20;
  
  local_28 = filter_handle_value->data_;
  sStack_20 = filter_handle_value->size_;
  local_48.data_._0_4_ = 0xffffffff;
  local_48.data_._4_4_ = 0xffffffff;
  local_48.size_._0_4_ = 0xffffffff;
  local_48.size_._4_4_ = 0xffffffff;
  BlockHandle::DecodeFrom((BlockHandle *)local_78,&local_48);
  pvVar1 = (void *)CONCAT62(local_78._2_6_,CONCAT11(local_78[1],local_78[0]));
  if (pvVar1 == (void *)0x0) {
    local_78[1] = true;
    local_78._8_16_ = (undefined1  [16])0x0;
    dbOptions = this->rep_;
    local_78[0] = (dbOptions->options).paranoid_checks == true;
    local_60.data.data_ = "";
    local_60.data.size_ = 0;
    ReadBlock((leveldb *)&local_30,dbOptions->file,&dbOptions->options,(ReadOptions *)local_78,
              (BlockHandle *)&local_48,&local_60);
    pvVar1 = local_30;
    if (local_30 == (void *)0x0) {
      if (local_60.heap_allocated == true) {
        this->rep_->filter_data = local_60.data.data_;
      }
      this_00 = (FilterBlockReader *)operator_new(0x28);
      FilterBlockReader::FilterBlockReader
                (this_00,(this->rep_->options).filter_policy,&local_60.data);
      this->rep_->filter = this_00;
      return;
    }
  }
  operator_delete__(pvVar1);
  return;
}

Assistant:

void Table::ReadFilter(const Slice& filter_handle_value) {
  Slice v = filter_handle_value;
  BlockHandle filter_handle;
  if (!filter_handle.DecodeFrom(&v).ok()) {
    return;
  }

  // We might want to unify with ReadBlock() if we start
  // requiring checksum verification in Table::Open.
  ReadOptions opt;
  if (rep_->options.paranoid_checks) {
    opt.verify_checksums = true;
  }
  BlockContents block;
  if (!ReadBlock(rep_->file, rep_->options, opt, filter_handle, &block).ok()) {
    return;
  }
  if (block.heap_allocated) {
    rep_->filter_data = block.data.data();  // Will need to delete later
  }
  rep_->filter = new FilterBlockReader(rep_->options.filter_policy, block.data);
}